

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O3

void __thiscall
ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
set<ArenaVector<wasm::Expression*>>
          (ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *this,
          ArenaVector<wasm::Expression_*> *list)

{
  ulong uVar1;
  void *pvVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = (list->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).
          usedElements;
  uVar3 = uVar1;
  if (*(ulong *)(this + 0x10) < uVar1) {
    *(ulong *)(this + 0x10) = uVar1;
    pvVar2 = MixedArena::allocSpace(*(MixedArena **)(this + 0x18),uVar1 * 8,8);
    *(void **)this = pvVar2;
    uVar3 = (list->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).
            usedElements;
  }
  if (uVar3 != 0) {
    uVar4 = 0;
    do {
      *(Expression **)(*(long *)this + uVar4 * 8) =
           (list->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).data
           [uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
  }
  *(ulong *)(this + 8) = uVar1;
  return;
}

Assistant:

void set(const ListType& list) {
    size_t size = list.size();
    if (allocatedElements < size) {
      static_cast<SubType*>(this)->allocate(size);
    }
    size_t i = 0;
    for (auto elem : list) {
      data[i++] = elem;
    }
    usedElements = size;
  }